

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
          (iterator *__return_storage_ptr__,void *this,QString *key,StyleRule *args)

{
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *pDVar1;
  long in_FS_OFFSET;
  StyleRule local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
    local_68.selectors.d.d = (Data *)0x0;
    local_68.selectors.d.ptr = *(Selector **)((long)this + 8);
LAB_005e6eca:
    pDVar1 = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0;
LAB_005e6ef6:
    pDVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> **)this = pDVar1;
LAB_005e6eff:
    emplace_helper<QCss::StyleRule_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
              ((QMultiHash<QString,_QCss::StyleRule> *)&local_68);
  }
  else {
    if (1 < (uint)(((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i) {
      local_68.selectors.d.ptr = *(Selector **)((long)this + 8);
      local_68.selectors.d.d = (Data *)pDVar1;
      if ((((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *this;
        if (pDVar1 == (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0)
        goto LAB_005e6eca;
      }
      if (1 < (uint)(((QArrayData *)&pDVar1->ref)->ref_)._q_value.super___atomic_base<int>._M_i)
      goto LAB_005e6ef6;
      goto LAB_005e6eff;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<QCss::StyleRule_const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_005e6fb4;
    }
    local_68.selectors.d.d = (args->selectors).d.d;
    local_68.selectors.d.ptr = (args->selectors).d.ptr;
    local_68.selectors.d.size = (args->selectors).d.size;
    if ((Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)local_68.selectors.d.d !=
        (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
      LOCK();
      (((QArrayData *)
       &((Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)local_68.selectors.d.d)->ref)->
      ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)local_68.selectors.d.d)->
             ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.declarations.d.d = (args->declarations).d.d;
    local_68.declarations.d.ptr = (args->declarations).d.ptr;
    local_68.declarations.d.size = (args->declarations).d.size;
    if (local_68.declarations.d.d != (Data *)0x0) {
      LOCK();
      ((local_68.declarations.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.declarations.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
    local_68.order = args->order;
    QMultiHash<QString,_QCss::StyleRule>::emplace_helper<QCss::StyleRule>
              (__return_storage_ptr__,(QMultiHash<QString,_QCss::StyleRule> *)this,key,&local_68);
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_68.declarations.d);
    QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
              ((QArrayDataPointer<QCss::Selector> *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_005e6fb4:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }